

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O2

int scroll_menu_h_scroll_top_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  int iVar4;
  bool bVar5;
  Am_Object group;
  Am_Widget_Look look;
  
  Am_Object::Get_Owner(&group,(Am_Slot_Flags)self);
  pAVar3 = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&look,pAVar3);
  bVar5 = look.value == Am_MOTIF_LOOK.value;
  pAVar3 = Am_Object::Get(&group,0x18c,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
  if (bVar1) {
    iVar4 = (uint)!bVar5 * 2 + 1;
  }
  else {
    pAVar3 = Am_Object::Get(&group,0x67,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    pAVar3 = Am_Object::Get(self,0x67,0);
    iVar4 = Am_Value::operator_cast_to_int(pAVar3);
    iVar4 = (iVar2 + (-(uint)bVar5 | 0xfffffffd)) - iVar4;
  }
  Am_Object::~Am_Object(&group);
  return iVar4;
}

Assistant:

Am_Define_Formula(int, scroll_menu_h_scroll_top)
{
  Am_Object group = self.Get_Owner();
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  int scroll_border = (look == Am_MOTIF_LOOK) ? -1 : -3;
  if ((bool)group.Get(Am_H_SCROLL_BAR_ON_TOP))
    return -scroll_border;
  else // on bottom
    return (int)group.Get(Am_HEIGHT) - (int)self.Get(Am_HEIGHT) + scroll_border;
}